

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

void * PARMCI_Memat(armci_meminfo_t *meminfo,long offset)

{
  int *in_RSI;
  long in_RDI;
  int rank;
  void *ptr;
  int in_stack_ffffffffffffffdc;
  char *msg;
  undefined8 local_8;
  
  msg = (char *)0x0;
  comex_group_rank((comex_group_t)((ulong)in_RDI >> 0x20),in_RSI);
  if (in_RDI == 0) {
    comex_error(msg,in_stack_ffffffffffffffdc);
  }
  if (*(int *)(in_RDI + 0x18) == in_stack_ffffffffffffffdc) {
    local_8 = *(void **)(in_RDI + 8);
  }
  else {
    local_8 = *(void **)(in_RDI + 8);
  }
  return local_8;
}

Assistant:

void* PARMCI_Memat(armci_meminfo_t *meminfo, long offset)
{
    void *ptr=NULL;
    int rank;

    comex_group_rank(COMEX_GROUP_WORLD, &rank);

    if(meminfo==NULL) comex_error("PARMCI_Memat: Invalid arg #1 (NULL ptr)",0);

    if(meminfo->cpid==rank) { ptr = meminfo->addr; return ptr; }

    ptr = meminfo->addr;

    return ptr;
}